

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::MemPass::GetPtr(MemPass *this,uint32_t ptrId,uint32_t *varId)

{
  Op OVar1;
  uint32_t uVar2;
  DefUseManager *pDVar3;
  MemPass *pMStack_38;
  uint32_t temp;
  Instruction *varInst;
  Instruction *ptrInst;
  uint32_t *varId_local;
  uint32_t ptrId_local;
  MemPass *this_local;
  
  *varId = ptrId;
  pDVar3 = Pass::get_def_use_mgr(&this->super_Pass);
  varInst = analysis::DefUseManager::GetDef(pDVar3,*varId);
  OVar1 = opt::Instruction::opcode(varInst);
  if (OVar1 == OpConstantNull) {
    *varId = 0;
    this_local = (MemPass *)varInst;
  }
  else {
    OVar1 = opt::Instruction::opcode(varInst);
    pMStack_38 = (MemPass *)varInst;
    if ((OVar1 != OpVariable) &&
       (OVar1 = opt::Instruction::opcode(varInst), OVar1 != OpFunctionParameter)) {
      pMStack_38 = (MemPass *)opt::Instruction::GetBaseAddress(varInst);
    }
    OVar1 = opt::Instruction::opcode((Instruction *)pMStack_38);
    if (OVar1 == OpVariable) {
      uVar2 = opt::Instruction::result_id((Instruction *)pMStack_38);
      *varId = uVar2;
    }
    else {
      *varId = 0;
    }
    while (OVar1 = opt::Instruction::opcode(varInst), OVar1 == OpCopyObject) {
      uVar2 = opt::Instruction::GetSingleWordInOperand(varInst,0);
      pDVar3 = Pass::get_def_use_mgr(&this->super_Pass);
      varInst = analysis::DefUseManager::GetDef(pDVar3,uVar2);
    }
    this_local = (MemPass *)varInst;
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* MemPass::GetPtr(uint32_t ptrId, uint32_t* varId) {
  *varId = ptrId;
  Instruction* ptrInst = get_def_use_mgr()->GetDef(*varId);
  Instruction* varInst;

  if (ptrInst->opcode() == spv::Op::OpConstantNull) {
    *varId = 0;
    return ptrInst;
  }

  if (ptrInst->opcode() != spv::Op::OpVariable &&
      ptrInst->opcode() != spv::Op::OpFunctionParameter) {
    varInst = ptrInst->GetBaseAddress();
  } else {
    varInst = ptrInst;
  }
  if (varInst->opcode() == spv::Op::OpVariable) {
    *varId = varInst->result_id();
  } else {
    *varId = 0;
  }

  while (ptrInst->opcode() == spv::Op::OpCopyObject) {
    uint32_t temp = ptrInst->GetSingleWordInOperand(0);
    ptrInst = get_def_use_mgr()->GetDef(temp);
  }

  return ptrInst;
}